

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O0

int GetFrameSBG(SBG *pSBG,SBGDATA *pSBGData)

{
  int iVar1;
  double dVar2;
  int local_20a4;
  undefined1 local_20a0 [8];
  CHRONO chrono;
  int local_2050;
  int mclass;
  int mid;
  int framelen;
  uchar *ptr;
  int local_2038;
  int nbBytesDiscarded;
  int nbBytesToRequest;
  int res;
  int recvbuflen;
  int BytesReceived;
  uchar recvbuf [8192];
  SBGDATA *pSBGData_local;
  SBG *pSBG_local;
  
  res = 0;
  nbBytesToRequest = 0;
  nbBytesDiscarded = 1;
  local_2038 = 0;
  ptr._4_4_ = 0;
  _mid = (uchar *)0x0;
  mclass = 0;
  local_2050 = 0;
  chrono._68_4_ = 0;
  StartChrono((CHRONO *)local_20a0);
  memset(&recvbuflen,0,0x2000);
  nbBytesToRequest = 0x1fff;
  res = 0;
  local_2038 = 9;
  iVar1 = ReadAllRS232Port(&pSBG->RS232Port,(uint8 *)&recvbuflen,9);
  if (iVar1 == 0) {
    res = local_2038 + res;
    do {
      nbBytesDiscarded =
           FindFrameSBG((uchar *)&recvbuflen,res,&local_2050,(int *)&chrono.field_0x44,&mclass,
                        &local_2038,(uchar **)&mid,(int *)((long)&ptr + 4));
      if (nbBytesDiscarded == 0) {
        if (0 < (res - ptr._4_4_) - mclass) {
          printf("Warning getting data from a SBG : Unexpected data after a frame. \n");
        }
        iVar1 = ProcessFrameSBG(pSBG,_mid,mclass,local_2050,chrono._68_4_,pSBGData);
        if (iVar1 != 0) {
          return 1;
        }
        return 0;
      }
      if (nbBytesDiscarded == 1) {
        if (ptr._4_4_ < 10) {
          local_20a4 = ptr._4_4_;
        }
        else {
          local_20a4 = 9;
        }
        local_2038 = local_20a4;
      }
      memmove(&recvbuflen,(void *)((long)&recvbuflen + (long)ptr._4_4_),(long)(res - ptr._4_4_));
      res = res - ptr._4_4_;
      if (nbBytesToRequest < res + local_2038) {
        printf("Error reading data from a SBG : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadAllRS232Port(&pSBG->RS232Port,(uint8 *)((long)&recvbuflen + (long)res),local_2038)
      ;
      if (iVar1 != 0) {
        printf("Error reading data from a SBG. \n");
        return 1;
      }
      res = local_2038 + res;
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_20a0);
    } while (dVar2 <= 4.0);
    printf("Error reading data from a SBG : Frame timeout. \n");
    pSBG_local._4_4_ = 2;
  }
  else {
    printf("Error reading data from a SBG. \n");
    pSBG_local._4_4_ = 1;
  }
  return pSBG_local._4_4_;
}

Assistant:

inline int GetFrameSBG(SBG* pSBG, SBGDATA* pSBGData)
{
	unsigned char recvbuf[MAX_NB_BYTES_SBG];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int framelen = 0;
	int mid = 0, mclass = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SBG-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_FRAME_LEN_SBG;
	if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SBG. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindFrameSBG(recvbuf, BytesReceived, &mid, &mclass, &framelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_FRAME_LEN_SBG, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a SBG : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a SBG. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SBG)
		{
			printf("Error reading data from a SBG : Frame timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-framelen > 0)
	{
		printf("Warning getting data from a SBG : Unexpected data after a frame. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *pframelen)
	//{
	//	printf("Error getting data from a SBG : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*pframelen > 0)
	//{
	//	memcpy(databuf, ptr, *pframelen);
	//}

	if (ProcessFrameSBG(pSBG, ptr, framelen, mid, mclass, pSBGData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}